

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall xLearn::Solver::init_train(Solver *this)

{
  string *score_func;
  string *psVar1;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *pvVar2;
  long *plVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  index_t iVar7;
  ThreadPool *this_00;
  ostream *poVar8;
  Reader *pRVar9;
  Model *pMVar10;
  Score *pSVar11;
  Loss *this_01;
  Metric *this_02;
  uint uVar12;
  size_t sVar13;
  Logger *this_03;
  ulong uVar14;
  long lVar15;
  int i;
  uint uVar16;
  int i_1;
  ulong uVar17;
  float fVar18;
  allocator local_ae;
  allocator local_ad;
  Logger local_ac;
  string filename;
  string local_88;
  DMatrix *matrix;
  pointer pbStack_60;
  pointer local_58;
  ulong local_50;
  ulong local_48;
  Timer timer;
  
  uVar5 = std::thread::hardware_concurrency();
  sVar13 = (size_t)(this->hyper_param_).thread_number;
  uVar17 = (ulong)uVar5;
  if (sVar13 != 0) {
    uVar17 = sVar13;
  }
  this_00 = (ThreadPool *)operator_new(0x120);
  ThreadPool::ThreadPool(this_00,uVar17);
  this->pool_ = this_00;
  StringPrintf_abi_cxx11_(&filename,"xLearn uses %i threads for training task.",uVar17);
  Color::print_info(&filename,false);
  std::__cxx11::string::~string((string *)&filename);
  Timer::Timer(&timer);
  Timer::tic(&timer);
  std::__cxx11::string::string((string *)&filename,"Read Problem ...",(allocator *)&local_88);
  Color::print_action(&filename);
  std::__cxx11::string::~string((string *)&filename);
  matrix = (DMatrix *)((ulong)matrix._4_4_ << 0x20);
  std::__cxx11::string::string
            ((string *)&filename,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
             ,(allocator *)&local_ac);
  std::__cxx11::string::string((string *)&local_88,"init_train",&local_ae);
  poVar8 = Logger::Start(INFO,&filename,0xcf,&local_88);
  std::operator<<(poVar8,"Start to init Reader");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&filename);
  Logger::~Logger((Logger *)&matrix);
  bVar4 = (this->hyper_param_).from_file;
  if (((bool)bVar4 == true) && ((this->hyper_param_).cross_validation == true)) {
    iVar6 = (this->hyper_param_).num_folds;
    if (iVar6 < 1) {
      matrix = (DMatrix *)CONCAT44(matrix._4_4_,2);
      std::__cxx11::string::string
                ((string *)&filename,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                 ,(allocator *)&local_ac);
      std::__cxx11::string::string((string *)&local_88,"init_train",&local_ae);
      poVar8 = Logger::Start(ERR,&filename,0xd3,&local_88);
      poVar8 = std::operator<<(poVar8,"CHECK_GT failed ");
      poVar8 = std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                              );
      poVar8 = std::operator<<(poVar8,":");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xd3);
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"hyper_param_.num_folds");
      poVar8 = std::operator<<(poVar8," = ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->hyper_param_).num_folds);
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"0");
      poVar8 = std::operator<<(poVar8," = ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0);
      std::operator<<(poVar8,"\n");
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&filename);
      this_03 = (Logger *)&matrix;
      goto LAB_0013b239;
    }
    FileSpliter::split((FileSpliter *)&this->field_0x268,&(this->hyper_param_).train_set_file,iVar6)
    ;
    matrix = (DMatrix *)((ulong)matrix & 0xffffffff00000000);
    std::__cxx11::string::string
              ((string *)&filename,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,(allocator *)&local_ac);
    std::__cxx11::string::string((string *)&local_88,"init_train",&local_ae);
    poVar8 = Logger::Start(INFO,&filename,0xd6,&local_88);
    poVar8 = std::operator<<(poVar8,"Split file into ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->hyper_param_).num_folds);
    std::operator<<(poVar8," parts.");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&filename);
    Logger::~Logger((Logger *)&matrix);
    bVar4 = (this->hyper_param_).from_file;
  }
  if ((bVar4 & 1) != 0) {
    matrix = (DMatrix *)0x0;
    pbStack_60 = (pointer)0x0;
    local_58 = (pointer)0x0;
    if ((this->hyper_param_).cross_validation == true) {
      uVar5 = (this->hyper_param_).num_folds;
      uVar12 = uVar5;
      for (uVar16 = 0; (int)uVar16 < (int)uVar12; uVar16 = uVar16 + 1) {
        StringPrintf_abi_cxx11_
                  (&filename,"%s_%d",(this->hyper_param_).train_set_file._M_dataplus._M_p,
                   (ulong)uVar16);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&matrix,&filename);
        std::__cxx11::string::~string((string *)&filename);
        uVar12 = (this->hyper_param_).num_folds;
      }
    }
    else {
      if ((this->hyper_param_).train_set_file._M_string_length == 0) {
        local_ac.severity_ = ERR;
        std::__cxx11::string::string
                  ((string *)&filename,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                   ,&local_ae);
        std::__cxx11::string::string((string *)&local_88,"init_train",&local_ad);
        poVar8 = Logger::Start(ERR,&filename,0xe8,&local_88);
        poVar8 = std::operator<<(poVar8,"CHECK_NE failed ");
        poVar8 = std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                                );
        poVar8 = std::operator<<(poVar8,":");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe8);
        poVar8 = std::operator<<(poVar8,"\n");
        poVar8 = std::operator<<(poVar8,"hyper_param_.train_set_file.empty()");
        poVar8 = std::operator<<(poVar8," = ");
        poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
        poVar8 = std::operator<<(poVar8,"\n");
        poVar8 = std::operator<<(poVar8,"true");
        poVar8 = std::operator<<(poVar8," = ");
        poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
        std::operator<<(poVar8,"\n");
        goto LAB_0013b220;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&matrix,&(this->hyper_param_).train_set_file);
      if ((this->hyper_param_).validate_set_file._M_string_length == 0) {
        uVar5 = 1;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&matrix,&(this->hyper_param_).validate_set_file);
        uVar5 = 2;
      }
    }
    local_ac.severity_ = INFO;
    std::__cxx11::string::string
              ((string *)&filename,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,&local_ae);
    std::__cxx11::string::string((string *)&local_88,"init_train",&local_ad);
    poVar8 = Logger::Start(INFO,&filename,0xef,&local_88);
    poVar8 = std::operator<<(poVar8,"Number of Reader: ");
    std::ostream::operator<<(poVar8,uVar5);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&filename);
    Logger::~Logger(&local_ac);
    filename._M_dataplus._M_p = (pointer)0x0;
    pvVar2 = &this->reader_;
    std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::resize
              (pvVar2,(long)(int)uVar5,(value_type *)&filename);
    lVar15 = 0;
    local_48 = (ulong)(~((int)uVar5 >> 0x1f) & uVar5);
    local_50 = local_48 << 5;
    for (uVar17 = 0; local_50 != uVar17; uVar17 = uVar17 + 0x20) {
      pRVar9 = create_reader(this);
      *(Reader **)
       ((long)(this->reader_).
              super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
              super__Vector_impl_data._M_start + lVar15) = pRVar9;
      Reader::SetBlockSize
                (*(Reader **)
                  ((long)(this->reader_).
                         super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar15),
                 (long)(this->hyper_param_).block_size);
      plVar3 = *(long **)((long)(this->reader_).
                                super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar15);
      *(int *)(plVar3 + 0x1a) = (this->hyper_param_).seed;
      if ((this->hyper_param_).bin_out == false) {
        *(undefined1 *)((long)plVar3 + 0x9a) = 0;
      }
      (**(code **)(*plVar3 + 0x10))(plVar3,(long)&matrix->hash_value_1 + uVar17);
      if ((this->hyper_param_).on_disk == false) {
        plVar3 = *(long **)((long)(pvVar2->
                                  super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start + lVar15);
        (**(code **)(*plVar3 + 0x40))(plVar3,1);
      }
      if (*(long *)((long)(pvVar2->
                          super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                          _M_impl.super__Vector_impl_data._M_start + lVar15) == 0) {
        StringPrintf_abi_cxx11_
                  (&filename,"Cannot open the file %s",
                   *(undefined8 *)((long)&matrix->hash_value_1 + uVar17));
        Color::print_error(&filename);
        std::__cxx11::string::~string((string *)&filename);
        exit(0);
      }
      local_ac.severity_ = INFO;
      std::__cxx11::string::string
                ((string *)&filename,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                 ,&local_ae);
      std::__cxx11::string::string((string *)&local_88,"init_train",&local_ad);
      poVar8 = Logger::Start(INFO,&filename,0x104,&local_88);
      poVar8 = std::operator<<(poVar8,"Init Reader: ");
      std::operator<<(poVar8,(string *)((long)&matrix->hash_value_1 + uVar17));
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&filename);
      Logger::~Logger(&local_ac);
      lVar15 = lVar15 + 8;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&matrix);
LAB_0013a9b0:
    score_func = &(this->hyper_param_).score_func;
    uVar5 = 0;
    local_50 = local_50 & 0xffffffff00000000;
    matrix = (DMatrix *)0x0;
    for (uVar17 = 0; uVar17 != local_48; uVar17 = uVar17 + 1) {
      while (pRVar9 = (this->reader_).
                      super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar17],
            iVar6 = (*pRVar9->_vptr_Reader[4])(pRVar9,&matrix), iVar6 != 0) {
        iVar7 = DMatrix::MaxFeat(matrix);
        if (uVar5 < iVar7) {
          uVar5 = iVar7;
        }
        iVar6 = std::__cxx11::string::compare((char *)score_func);
        if (iVar6 == 0) {
          iVar7 = DMatrix::MaxField(matrix);
          uVar12 = (uint)local_50;
          if ((uint)local_50 < iVar7) {
            uVar12 = iVar7;
          }
          local_50 = CONCAT44(local_50._4_4_,uVar12);
        }
      }
      (*(this->reader_).super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar17]->_vptr_Reader[5])();
    }
    (this->hyper_param_).num_feature = uVar5 + 1;
    if (uVar5 + 1 == 0) {
      std::__cxx11::string::string
                ((string *)&filename,"Feature index is too large (overflow).",(allocator *)&local_88
                );
      Color::print_error(&filename);
      std::__cxx11::string::~string((string *)&filename);
      local_ac.severity_ = FATAL;
      std::__cxx11::string::string
                ((string *)&filename,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                 ,&local_ae);
      std::__cxx11::string::string((string *)&local_88,"init_train",&local_ad);
      poVar8 = Logger::Start(FATAL,&filename,0x139,&local_88);
      std::operator<<(poVar8,"Feature index is too large (overflow).");
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&filename);
      Logger::~Logger(&local_ac);
    }
    local_ac.severity_ = INFO;
    std::__cxx11::string::string
              ((string *)&filename,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,&local_ae);
    std::__cxx11::string::string((string *)&local_88,"init_train",&local_ad);
    poVar8 = Logger::Start(INFO,&filename,0x13b,&local_88);
    poVar8 = std::operator<<(poVar8,"Number of feature: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&filename);
    Logger::~Logger(&local_ac);
    StringPrintf_abi_cxx11_
              (&filename,"Number of Feature: %d",(ulong)(this->hyper_param_).num_feature);
    Color::print_info(&filename,false);
    std::__cxx11::string::~string((string *)&filename);
    iVar6 = std::__cxx11::string::compare((char *)score_func);
    if (iVar6 == 0) {
      (this->hyper_param_).num_field = (uint)local_50 + 1;
      local_ac.severity_ = INFO;
      std::__cxx11::string::string
                ((string *)&filename,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                 ,&local_ae);
      std::__cxx11::string::string((string *)&local_88,"init_train",&local_ad);
      poVar8 = Logger::Start(INFO,&filename,0x142,&local_88);
      poVar8 = std::operator<<(poVar8,"Number of field: ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&filename);
      Logger::~Logger(&local_ac);
      StringPrintf_abi_cxx11_(&filename,"Number of Field: %d",(ulong)(this->hyper_param_).num_field)
      ;
      Color::print_info(&filename,false);
      std::__cxx11::string::~string((string *)&filename);
    }
    fVar18 = Timer::toc(&timer);
    StringPrintf_abi_cxx11_(&filename,"Time cost for reading problem: %.2f (sec)",(double)fVar18);
    Color::print_info(&filename,false);
    std::__cxx11::string::~string((string *)&filename);
    Timer::reset(&timer);
    Timer::tic(&timer);
    std::__cxx11::string::string((string *)&filename,"Initialize model ...",(allocator *)&local_88);
    Color::print_action(&filename);
    std::__cxx11::string::~string((string *)&filename);
    if ((this->hyper_param_).pre_model_file._M_string_length == 0) {
      pMVar10 = (Model *)operator_new(0x90);
      psVar1 = &(this->hyper_param_).opt_type;
      (pMVar10->score_func_)._M_dataplus._M_p = (pointer)&(pMVar10->score_func_).field_2;
      (pMVar10->score_func_)._M_string_length = 0;
      (pMVar10->score_func_).field_2._M_local_buf[0] = '\0';
      (pMVar10->loss_func_)._M_dataplus._M_p = (pointer)&(pMVar10->loss_func_).field_2;
      (pMVar10->loss_func_)._M_string_length = 0;
      (pMVar10->loss_func_).field_2._M_local_buf[0] = '\0';
      pMVar10->param_w_ = (real_t *)0x0;
      pMVar10->param_v_ = (real_t *)0x0;
      pMVar10->param_b_ = (real_t *)0x0;
      pMVar10->param_best_w_ = (real_t *)0x0;
      pMVar10->param_b_ = (real_t *)0x0;
      pMVar10->param_best_w_ = (real_t *)0x0;
      pMVar10->param_best_v_ = (real_t *)0x0;
      pMVar10->param_best_b_ = (real_t *)0x0;
      this->model_ = pMVar10;
      iVar6 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar6 == 0) {
        (this->hyper_param_).auxiliary_size = 1;
        iVar7 = 1;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar6 == 0) {
          (this->hyper_param_).auxiliary_size = 2;
          iVar7 = 2;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar6 == 0) {
            (this->hyper_param_).auxiliary_size = 3;
            iVar7 = 3;
          }
          else {
            iVar7 = (this->hyper_param_).auxiliary_size;
          }
        }
      }
      Model::Initialize(this->model_,score_func,&(this->hyper_param_).loss_func,
                        (this->hyper_param_).num_feature,(this->hyper_param_).num_field,
                        (this->hyper_param_).num_K,iVar7,(this->hyper_param_).model_scale);
      pMVar10 = this->model_;
    }
    else {
      pMVar10 = (Model *)operator_new(0x90);
      Model::Model(pMVar10,&(this->hyper_param_).pre_model_file);
      this->model_ = pMVar10;
    }
    uVar5 = pMVar10->param_num_w_ + 2 + pMVar10->param_num_v_;
    (this->hyper_param_).num_param = uVar5;
    local_ac.severity_ = INFO;
    std::__cxx11::string::string
              ((string *)&filename,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,&local_ae);
    std::__cxx11::string::string((string *)&local_88,"init_train",&local_ad);
    poVar8 = Logger::Start(INFO,&filename,0x168,&local_88);
    poVar8 = std::operator<<(poVar8,"Number parameters: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&filename);
    Logger::~Logger(&local_ac);
    PrintSize_abi_cxx11_(&local_88,(ulong)uVar5 << 2);
    StringPrintf_abi_cxx11_(&filename,"Model size: %s",local_88._M_dataplus._M_p);
    Color::print_info(&filename,false);
    std::__cxx11::string::~string((string *)&filename);
    std::__cxx11::string::~string((string *)&local_88);
    fVar18 = Timer::toc(&timer);
    StringPrintf_abi_cxx11_(&filename,"Time cost for model initial: %.2f (sec)",(double)fVar18);
    Color::print_info(&filename,false);
    std::__cxx11::string::~string((string *)&filename);
    pSVar11 = create_score(this);
    this->score_ = pSVar11;
    (*pSVar11->_vptr_Score[2])
              ((ulong)(uint)(this->hyper_param_).learning_rate,
               (ulong)(uint)(this->hyper_param_).regu_lambda,(ulong)(uint)(this->hyper_param_).alpha
               ,(ulong)(uint)(this->hyper_param_).beta,(ulong)(uint)(this->hyper_param_).lambda_1,
               (ulong)(uint)(this->hyper_param_).lambda_2,pSVar11,&(this->hyper_param_).opt_type);
    local_ac.severity_ = INFO;
    std::__cxx11::string::string
              ((string *)&filename,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,&local_ae);
    std::__cxx11::string::string((string *)&local_88,"init_train",&local_ad);
    poVar8 = Logger::Start(INFO,&filename,0x17c,&local_88);
    std::operator<<(poVar8,"Initialize score function.");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&filename);
    Logger::~Logger(&local_ac);
    this_01 = create_loss(this);
    this->loss_ = this_01;
    Loss::Initialize(this_01,this->score_,this->pool_,(this->hyper_param_).norm,
                     (this->hyper_param_).lock_free,0);
    local_ac.severity_ = INFO;
    std::__cxx11::string::string
              ((string *)&filename,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,&local_ae);
    std::__cxx11::string::string((string *)&local_88,"init_train",&local_ad);
    poVar8 = Logger::Start(INFO,&filename,0x184,&local_88);
    std::operator<<(poVar8,"Initialize loss function.");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&filename);
    Logger::~Logger(&local_ac);
    this_02 = create_metric(this);
    this->metric_ = this_02;
    if (this_02 != (Metric *)0x0) {
      Metric::Initialize(this_02,this->pool_);
    }
    local_ac.severity_ = INFO;
    std::__cxx11::string::string
              ((string *)&filename,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,&local_ae);
    std::__cxx11::string::string((string *)&local_88,"init_train",&local_ad);
    poVar8 = Logger::Start(INFO,&filename,0x18c,&local_88);
    std::operator<<(poVar8,"Initialize evaluation metric.");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&filename);
    Logger::~Logger(&local_ac);
    return;
  }
  matrix = (DMatrix *)0x0;
  pbStack_60 = (pointer)0x0;
  local_58 = (pointer)0x0;
  if ((this->hyper_param_).train_dataset != (DMatrix *)0x0) {
    std::vector<xLearn::DMatrix_*,_std::allocator<xLearn::DMatrix_*>_>::push_back
              ((vector<xLearn::DMatrix_*,_std::allocator<xLearn::DMatrix_*>_> *)&matrix,
               &(this->hyper_param_).train_dataset);
    if ((this->hyper_param_).valid_dataset == (DMatrix *)0x0) {
      uVar5 = 1;
    }
    else {
      std::vector<xLearn::DMatrix_*,_std::allocator<xLearn::DMatrix_*>_>::push_back
                ((vector<xLearn::DMatrix_*,_std::allocator<xLearn::DMatrix_*>_> *)&matrix,
                 &(this->hyper_param_).valid_dataset);
      uVar5 = 2;
    }
    local_ac.severity_ = INFO;
    std::__cxx11::string::string
              ((string *)&filename,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,&local_ae);
    std::__cxx11::string::string((string *)&local_88,"init_train",&local_ad);
    poVar8 = Logger::Start(INFO,&filename,0x110,&local_88);
    poVar8 = std::operator<<(poVar8,"Number of Reader: ");
    std::ostream::operator<<(poVar8,uVar5);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&filename);
    Logger::~Logger(&local_ac);
    filename._M_dataplus._M_p = (pointer)0x0;
    pvVar2 = &this->reader_;
    std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::resize
              (pvVar2,(ulong)uVar5,(value_type *)&filename);
    uVar14 = 0;
    local_48 = (ulong)uVar5;
    for (uVar17 = 0; uVar5 * 8 != uVar17; uVar17 = uVar17 + 8) {
      pRVar9 = create_reader(this);
      *(Reader **)
       ((long)(this->reader_).
              super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
              super__Vector_impl_data._M_start + uVar17) = pRVar9;
      Reader::SetBlockSize
                (*(Reader **)
                  ((long)(this->reader_).
                         super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar17),
                 (long)(this->hyper_param_).block_size);
      plVar3 = *(long **)((long)(this->reader_).
                                super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar17);
      *(int *)(plVar3 + 0x1a) = (this->hyper_param_).seed;
      if ((this->hyper_param_).bin_out == false) {
        *(undefined1 *)((long)plVar3 + 0x9a) = 0;
      }
      (**(code **)(*plVar3 + 0x18))(plVar3,(long)&matrix->hash_value_1 + uVar17);
      if ((this->hyper_param_).on_disk == false) {
        plVar3 = *(long **)((long)(pvVar2->
                                  super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar17);
        (**(code **)(*plVar3 + 0x40))(plVar3,1);
      }
      if (*(long *)((long)(pvVar2->
                          super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                          _M_impl.super__Vector_impl_data._M_start + uVar17) == 0) {
        StringPrintf_abi_cxx11_(&filename,"Cannot open initialze dataset %d",uVar14);
        Color::print_error(&filename);
        std::__cxx11::string::~string((string *)&filename);
      }
      uVar14 = (ulong)((int)uVar14 + 1);
    }
    std::_Vector_base<xLearn::DMatrix_*,_std::allocator<xLearn::DMatrix_*>_>::~_Vector_base
              ((_Vector_base<xLearn::DMatrix_*,_std::allocator<xLearn::DMatrix_*>_> *)&matrix);
    goto LAB_0013a9b0;
  }
  local_ac.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&filename,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
             ,&local_ae);
  std::__cxx11::string::string((string *)&local_88,"init_train",&local_ad);
  poVar8 = Logger::Start(ERR,&filename,0x109,&local_88);
  poVar8 = std::operator<<(poVar8,"CHECK failed ");
  poVar8 = std::operator<<(poVar8,
                           "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                          );
  poVar8 = std::operator<<(poVar8,":");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x109);
  poVar8 = std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(poVar8,"hyper_param_.train_dataset");
  std::operator<<(poVar8," == NULL \n");
LAB_0013b220:
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&filename);
  this_03 = &local_ac;
LAB_0013b239:
  Logger::~Logger(this_03);
  abort();
}

Assistant:

void Solver::init_train() {
  /*********************************************************
   *  Initialize thread pool                               *
   *********************************************************/
  size_t threadNumber = std::thread::hardware_concurrency();
  if (hyper_param_.thread_number != 0) {
    threadNumber = hyper_param_.thread_number;
  }
  pool_ = new ThreadPool(threadNumber);
  Color::print_info(
    StringPrintf("xLearn uses %i threads for training task.",
             threadNumber)
  );
  /*********************************************************
   *  Initialize Reader                                    *
   *********************************************************/
  Timer timer;
  timer.tic();
  Color::print_action("Read Problem ...");
  LOG(INFO) << "Start to init Reader";
  // Split file
  if (hyper_param_.from_file) {
    if (hyper_param_.cross_validation) {
      CHECK_GT(hyper_param_.num_folds, 0);
      splitor_.split(hyper_param_.train_set_file,
                    hyper_param_.num_folds);
      LOG(INFO) << "Split file into "
                << hyper_param_.num_folds
                << " parts.";
    }
  }
  // Get the Reader list
  int num_reader = 0;
  if (hyper_param_.from_file) {
    std::vector<std::string> file_list;
    if (hyper_param_.cross_validation) {
      num_reader += hyper_param_.num_folds;
      for (int i = 0; i < hyper_param_.num_folds; ++i) {
        std::string filename = StringPrintf("%s_%d",
            hyper_param_.train_set_file.c_str(), i);
        file_list.push_back(filename);
      }
    } else {  // do not use cross-validation
      num_reader += 1;  // training file
      CHECK_NE(hyper_param_.train_set_file.empty(), true);
      file_list.push_back(hyper_param_.train_set_file);
      if (!hyper_param_.validate_set_file.empty()) {
        num_reader += 1;  // validation file
        file_list.push_back(hyper_param_.validate_set_file);
      }
    }
    LOG(INFO) << "Number of Reader: " << num_reader;
    reader_.resize(num_reader, nullptr);
    // Create Reader
    for (int i = 0; i < num_reader; ++i) {
      reader_[i] = create_reader();
      reader_[i]->SetBlockSize(hyper_param_.block_size);
      reader_[i]->SetSeed(hyper_param_.seed);
      if (hyper_param_.bin_out == false) {
        reader_[i]->SetNoBin();
      }
      reader_[i]->Initialize(file_list[i]);
      if (!hyper_param_.on_disk) {
        reader_[i]->SetShuffle(true);
      }
      if (reader_[i] == nullptr) {
        Color::print_error(
          StringPrintf("Cannot open the file %s",
              file_list[i].c_str())
        );
        exit(0);
      }
      LOG(INFO) << "Init Reader: " << file_list[i];
    } 
  } else {
    num_reader += 1;  // training dataset
    std::vector<xLearn::DMatrix*> data_list;
    CHECK_NOTNULL(hyper_param_.train_dataset);
    data_list.push_back(hyper_param_.train_dataset);
    if (hyper_param_.valid_dataset != nullptr) {
      num_reader += 1;  // validation dataset
      data_list.push_back(hyper_param_.valid_dataset);
    }
    // Create Reader
    LOG(INFO) << "Number of Reader: " << num_reader;
    reader_.resize(num_reader, nullptr);
    for (int i = 0; i < num_reader; ++i) {
      reader_[i] = create_reader();
      reader_[i]->SetBlockSize(hyper_param_.block_size);
      reader_[i]->SetSeed(hyper_param_.seed);
      if (hyper_param_.bin_out == false) {
        reader_[i]->SetNoBin();
      }
      reader_[i]->Initialize(data_list[i]);
      if (!hyper_param_.on_disk) {
        reader_[i]->SetShuffle(true);
      }
      if (reader_[i] == nullptr) {
        Color::print_error(
          StringPrintf("Cannot open initialze dataset %d", i));
      }
    }
  }
  /*********************************************************
   *  Read problem                                         *
   *********************************************************/
  DMatrix* matrix = nullptr;
  index_t max_feat = 0, max_field = 0;
  for (int i = 0; i < num_reader; ++i) {
    while(reader_[i]->Samples(matrix)) {
      int tmp = matrix->MaxFeat();
      if (tmp > max_feat) { max_feat = tmp; }
      if (hyper_param_.score_func.compare("ffm") == 0) {
        tmp = matrix->MaxField();
        if (tmp > max_field) { max_field = tmp; }
      }
    }
    // Return to the beginning of target file.
    reader_[i]->Reset();
  }
  hyper_param_.num_feature = max_feat + 1;
  // Check overflow:
  // INT_MAX +  = 0
  if (hyper_param_.num_feature == 0) {
    Color::print_error("Feature index is too large (overflow).");
    LOG(FATAL) << "Feature index is too large (overflow).";
  }
  LOG(INFO) << "Number of feature: " << hyper_param_.num_feature;
  Color::print_info(
    StringPrintf("Number of Feature: %d", 
                 hyper_param_.num_feature)
  );
  if (hyper_param_.score_func.compare("ffm") == 0) {
    hyper_param_.num_field = max_field + 1;
    LOG(INFO) << "Number of field: " << hyper_param_.num_field;
    Color::print_info(
      StringPrintf("Number of Field: %d", 
        hyper_param_.num_field)
    );
  }
  Color::print_info(
    StringPrintf("Time cost for reading problem: %.2f (sec)",
         timer.toc())
  );
  /*********************************************************
   *  Initialize Model                                     *
   *********************************************************/
  timer.reset();
  timer.tic();
  Color::print_action("Initialize model ...");
  // Initialize parameters from reader
  if (hyper_param_.pre_model_file.empty()) {
    model_ = new Model();
    if (hyper_param_.opt_type.compare("sgd") == 0) {
      hyper_param_.auxiliary_size = 1;
    } else if (hyper_param_.opt_type.compare("adagrad") == 0) {
      hyper_param_.auxiliary_size = 2;
    } else if (hyper_param_.opt_type.compare("ftrl") == 0) {
      hyper_param_.auxiliary_size = 3;
    }
    model_->Initialize(hyper_param_.score_func,
                     hyper_param_.loss_func,
                     hyper_param_.num_feature,
                     hyper_param_.num_field,
                     hyper_param_.num_K,
                     hyper_param_.auxiliary_size,
                     hyper_param_.model_scale);
  } else { // Initialize parameter from pre-trained model
    model_ = new Model(hyper_param_.pre_model_file);
  }
  index_t num_param = model_->GetNumParameter();
  hyper_param_.num_param = num_param;
  LOG(INFO) << "Number parameters: " << num_param;
  Color::print_info(
    StringPrintf("Model size: %s", 
         PrintSize(num_param*sizeof(real_t)).c_str())
  );
  Color::print_info(
    StringPrintf("Time cost for model initial: %.2f (sec)",
         timer.toc())
  );
  /*********************************************************
   *  Initialize score function                            *
   *********************************************************/
  score_ = create_score();
  score_->Initialize(hyper_param_.learning_rate,
                     hyper_param_.regu_lambda,
                     hyper_param_.alpha,
                     hyper_param_.beta,
                     hyper_param_.lambda_1,
                     hyper_param_.lambda_2,
                     hyper_param_.opt_type);
  LOG(INFO) << "Initialize score function.";
  /*********************************************************
   *  Initialize loss function                             *
   *********************************************************/
  loss_ = create_loss();
  loss_->Initialize(score_, pool_, 
         hyper_param_.norm, 
         hyper_param_.lock_free);
  LOG(INFO) << "Initialize loss function.";
  /*********************************************************
   *  Init metric                                          *
   *********************************************************/
  metric_ = create_metric();
  if (metric_ != nullptr) {
    metric_->Initialize(pool_);
  }
  LOG(INFO) << "Initialize evaluation metric.";
}